

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O0

void __thiscall
so_5::impl::disp_repository_t::install_exception_logger
          (disp_repository_t *this,event_exception_logger_unique_ptr_t *logger)

{
  pointer peVar1;
  event_exception_logger_unique_ptr_t *__u;
  unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
  local_30;
  unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
  local_28;
  event_exception_logger_unique_ptr_t old_logger;
  lock_guard<std::mutex> lock;
  event_exception_logger_unique_ptr_t *logger_local;
  disp_repository_t *this_local;
  
  peVar1 = std::
           unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
           ::get(logger);
  if (peVar1 != (pointer)0x0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&old_logger,&this->m_exception_logger_lock);
    std::
    unique_ptr<so_5::event_exception_logger_t,std::default_delete<so_5::event_exception_logger_t>>::
    unique_ptr<std::default_delete<so_5::event_exception_logger_t>,void>
              ((unique_ptr<so_5::event_exception_logger_t,std::default_delete<so_5::event_exception_logger_t>>
                *)&local_28);
    __u = &this->m_event_exception_logger;
    std::
    unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ::swap(&local_28,__u);
    std::
    unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ::swap(__u,logger);
    peVar1 = std::
             unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
             ::operator->(__u);
    std::
    unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ::unique_ptr(&local_30,logger);
    (*peVar1->_vptr_event_exception_logger_t[3])(peVar1,&local_30);
    std::
    unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ::~unique_ptr(&local_30);
    std::
    unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ::~unique_ptr(&local_28);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&old_logger);
  }
  return;
}

Assistant:

void
disp_repository_t::install_exception_logger(
	event_exception_logger_unique_ptr_t logger )
{
	if( nullptr != logger.get() )
	{
		std::lock_guard< std::mutex > lock( m_exception_logger_lock );

		event_exception_logger_unique_ptr_t old_logger;
		old_logger.swap( m_event_exception_logger );
		m_event_exception_logger.swap( logger );

		m_event_exception_logger->on_install( std::move( logger ) );
	}
}